

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo(cmComputeLinkInformation *this,string *fullPath)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  string soname;
  string file;
  string local_50;
  
  cmsys::SystemTools::GetFilenameName(&file,fullPath);
  this_00 = this->Makefile;
  std::__cxx11::string::string
            ((string *)&soname,"CMAKE_PLATFORM_HAS_INSTALLNAME",(allocator *)&local_50);
  bVar1 = cmMakefile::IsOn(this_00,&soname);
  std::__cxx11::string::~string((string *)&soname);
  if (bVar1) {
    soname._M_dataplus._M_p = (pointer)&soname.field_2;
    soname._M_string_length = 0;
    soname.field_2._M_local_buf[0] = '\0';
    bVar1 = cmSystemTools::GuessLibraryInstallName(fullPath,&soname);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&soname);
      goto LAB_002ebb39;
    }
    lVar3 = std::__cxx11::string::find((char *)&soname,0x48c829);
    std::__cxx11::string::~string((string *)&soname);
    if (lVar3 == -1) goto LAB_002ebb39;
  }
  bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,file._M_dataplus._M_p);
  if ((!bVar1) &&
     ((this->ArchivesMayBeShared != true ||
      (bVar1 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,file._M_dataplus._M_p)
      , !bVar1)))) {
    lVar3 = std::__cxx11::string::find((char *)fullPath,0x4675ec);
    if (lVar3 == -1) goto LAB_002ebb39;
    if ((AddLibraryRuntimeInfo(std::__cxx11::string_const&)::splitFramework == '\0') &&
       (iVar2 = __cxa_guard_acquire(&AddLibraryRuntimeInfo(std::__cxx11::string_const&)::
                                     splitFramework), iVar2 != 0)) {
      cmsys::RegularExpression::RegularExpression
                (&AddLibraryRuntimeInfo::splitFramework,"^(.*)/(.*).framework/(.*)$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &AddLibraryRuntimeInfo::splitFramework,&__dso_handle);
      __cxa_guard_release(&AddLibraryRuntimeInfo(std::__cxx11::string_const&)::splitFramework);
    }
    bVar1 = cmsys::RegularExpression::find(&AddLibraryRuntimeInfo::splitFramework,fullPath);
    if (!bVar1) goto LAB_002ebb39;
    cmsys::RegularExpression::match_abi_cxx11_(&soname,&AddLibraryRuntimeInfo::splitFramework,3);
    cmsys::RegularExpression::match_abi_cxx11_(&local_50,&AddLibraryRuntimeInfo::splitFramework,2);
    lVar3 = std::__cxx11::string::find((string *)&soname,(ulong)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&soname);
    if (lVar3 == -1) goto LAB_002ebb39;
  }
  cmOrderDirectories::AddRuntimeLibrary(this->OrderRuntimeSearchPath,fullPath,(char *)0x0);
  if (this->LinkWithRuntimePath == true) {
    cmOrderDirectories::AddRuntimeLibrary(this->OrderLinkerSearchPath,fullPath,(char *)0x0);
  }
LAB_002ebb39:
  std::__cxx11::string::~string((string *)&file);
  return;
}

Assistant:

void
cmComputeLinkInformation::AddLibraryRuntimeInfo(std::string const& fullPath)
{
  // Get the name of the library from the file name.
  bool is_shared_library = false;
  std::string file = cmSystemTools::GetFilenameName(fullPath);

  if(this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME"))
    {
    // Check that @rpath is part of the install name.
    // If it isn't, return.
    std::string soname;
    if(!cmSystemTools::GuessLibraryInstallName(fullPath, soname))
      {
      return;
      }

    if(soname.find("@rpath") == std::string::npos)
      {
      return;
      }
    }

  is_shared_library = this->ExtractSharedLibraryName.find(file);

  if(!is_shared_library)
    {
    // On some platforms (AIX) a shared library may look static.
    if(this->ArchivesMayBeShared)
      {
      if(this->ExtractStaticLibraryName.find(file.c_str()))
        {
        // This is the name of a shared library or archive.
        is_shared_library = true;
        }
      }
    }

  // It could be an Apple framework
  if(!is_shared_library)
    {
    if(fullPath.find(".framework") != std::string::npos)
      {
      static cmsys::RegularExpression
        splitFramework("^(.*)/(.*).framework/(.*)$");
      if(splitFramework.find(fullPath) &&
        (std::string::npos !=
         splitFramework.match(3).find(splitFramework.match(2))))
        {
        is_shared_library = true;
        }
      }
    }

  if(!is_shared_library)
    {
    return;
    }

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath);
  if(this->LinkWithRuntimePath)
    {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath);
    }
}